

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.cpp
# Opt level: O1

char __thiscall configFileReader::getNextChar(configFileReader *this)

{
  char toCheck;
  char cVar1;
  typeOfSeparator tVar2;
  
  if (this->readFromString == true) {
    toCheck = peekNextChar(this);
    this->index = this->index + 1;
  }
  else {
    openFile(this);
    toCheck = std::istream::get();
  }
  tVar2 = isSeparator(this,toCheck);
  cVar1 = ' ';
  if (tVar2 != space) {
    cVar1 = toCheck;
  }
  return cVar1;
}

Assistant:

char configFileReader::getNextChar() {
    char out;
    if (readFromString) {
        out = peekNextChar();
        index++;
    } else {
        openFile();
        out = (char) configFile->get();
    }
    if (isSeparator(out) == typeOfSeparator::space)
        out = ' ';

    return out;
}